

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ze_nullddi.cpp
# Opt level: O1

ze_result_t driver::zeFenceHostSynchronize(ze_fence_handle_t hFence,uint64_t timeout)

{
  ze_result_t zVar1;
  
  if (DAT_0010e518 != (code *)0x0) {
    zVar1 = (*DAT_0010e518)();
    return zVar1;
  }
  return ZE_RESULT_SUCCESS;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zeFenceHostSynchronize(
        ze_fence_handle_t hFence,                       ///< [in] handle of the fence
        uint64_t timeout                                ///< [in] if non-zero, then indicates the maximum time (in nanoseconds) to
                                                        ///< yield before returning ::ZE_RESULT_SUCCESS or ::ZE_RESULT_NOT_READY;
                                                        ///< if zero, then operates exactly like ::zeFenceQueryStatus;
                                                        ///< if `UINT64_MAX`, then function will not return until complete or
                                                        ///< device is lost.
                                                        ///< Due to external dependencies, timeout may be rounded to the closest
                                                        ///< value allowed by the accuracy of those dependencies.
        )
    {
        ze_result_t result = ZE_RESULT_SUCCESS;

        // if the driver has created a custom function, then call it instead of using the generic path
        auto pfnHostSynchronize = context.zeDdiTable.Fence.pfnHostSynchronize;
        if( nullptr != pfnHostSynchronize )
        {
            result = pfnHostSynchronize( hFence, timeout );
        }
        else
        {
            // generic implementation
        }

        return result;
    }